

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

PolymorphicInlineCacheInfo * __thiscall
Js::EntryPointPolymorphicInlineCacheInfo::GetInlineeInfo
          (EntryPointPolymorphicInlineCacheInfo *this,FunctionBody *inlineeFunctionBody)

{
  code *pcVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *pSVar6;
  SListNodeBase<Memory::Recycler> local_48;
  undefined1 local_40 [8];
  Iterator iter;
  
  pSVar6 = (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
           &this->inlineeInfo;
  local_40 = (undefined1  [8])pSVar6;
  iter.list = pSVar6;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    if (pSVar6 == (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    auVar2 = local_40;
    SListNodeBase<Memory::Recycler>::Next(&local_48);
    if (local_48.next.ptr == (Type)auVar2) break;
    SListNodeBase<Memory::Recycler>::Next(&local_48);
    iter.list = (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *)
                local_48.next.ptr;
    pTVar5 = SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Iterator::
             Data((Iterator *)local_40);
    pSVar6 = iter.list;
    if ((pTVar5->ptr->functionBody).ptr == inlineeFunctionBody) {
      return pTVar5->ptr;
    }
  }
  return (PolymorphicInlineCacheInfo *)0x0;
}

Assistant:

PolymorphicInlineCacheInfo * EntryPointPolymorphicInlineCacheInfo::GetInlineeInfo(FunctionBody * inlineeFunctionBody)
    {
        SListCounted<PolymorphicInlineCacheInfo*, Recycler>::Iterator iter(&inlineeInfo);
        while (iter.Next())
        {
            PolymorphicInlineCacheInfo * info = iter.Data();
            if (info->GetFunctionBody() == inlineeFunctionBody)
            {
                return info;
            }
        }

        return nullptr;
    }